

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

picnic_params_t_conflict argument_to_params(char *arg)

{
  char cVar1;
  picnic_params_t parameters;
  undefined1 *puVar2;
  long lVar3;
  undefined1 *puVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  picnic_params_t_conflict pVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  uint idx;
  string sarg;
  istringstream iss;
  picnic_params_t_conflict local_1e4;
  ulong local_1e0;
  long local_1d8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_1e0 = std::__cxx11::string::string((string *)&local_1d0,arg,(allocator *)&local_1b0);
  lVar9 = 0;
  do {
    parameters = *(picnic_params_t *)((long)&(anonymous_namespace)::all_parameters + lVar9);
    pcVar7 = picnic_get_param_name(parameters);
    std::__cxx11::string::string((string *)&local_1b0,pcVar7,(allocator *)&local_1e4);
    puVar4 = local_1b0;
    lVar3 = local_1c8;
    puVar2 = local_1d0;
    if (local_1c8 == local_1a8) {
      if (local_1c8 == 0) {
        local_1e0 = (ulong)parameters;
        bVar11 = true;
      }
      else {
        lVar10 = 0;
        local_1d8 = lVar9;
        do {
          cVar1 = puVar4[lVar10];
          iVar5 = tolower((int)(char)puVar2[lVar10]);
          iVar6 = tolower((int)cVar1);
          bVar11 = iVar5 == iVar6;
          lVar9 = local_1d8;
          if (!bVar11) goto LAB_0010e41c;
          lVar10 = lVar10 + 1;
        } while (lVar3 != lVar10);
        local_1e0 = (ulong)parameters;
      }
    }
    else {
      bVar11 = false;
    }
LAB_0010e41c:
    if (puVar4 != local_1a0) {
      operator_delete(puVar4);
    }
    if (bVar11) {
      pVar8 = (picnic_params_t_conflict)local_1e0;
      goto LAB_0010e4a1;
    }
    lVar9 = lVar9 + 4;
    if (lVar9 == 0x30) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1b0,(string *)&local_1d0,_S_in);
      std::istream::_M_extract<unsigned_int>((uint *)&local_1b0);
      if (local_1e4 - PARAMETER_SET_MAX_INDEX < 0xfffffff4) {
        local_1e4 = PARAMETER_SET_INVALID;
      }
      pVar8 = local_1e4;
      if ((abStack_190[*(long *)(local_1b0 + -0x18)] & 5) != 0) {
        pVar8 = PARAMETER_SET_INVALID;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
      std::ios_base::~ios_base(local_138);
LAB_0010e4a1:
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
      return pVar8;
    }
  } while( true );
}

Assistant:

picnic_params_t argument_to_params(const char* arg) {
  const std::string sarg{arg};

  for (const auto param : all_parameters) {
    const std::string name{picnic_get_param_name(param)};
    if (isequal(sarg, name)) {
      return param;
    }
  }

  std::istringstream iss{sarg};
  unsigned int idx;
  iss >> idx;
  if (!iss || idx == PARAMETER_SET_INVALID || idx >= PARAMETER_SET_MAX_INDEX) {
    return PARAMETER_SET_INVALID;
  }

  return static_cast<picnic_params_t>(idx);
}